

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateDestructorCode
          (MessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (this != internal_default_instance()) {\n  delete $name$_;\n}\n");
  return;
}

Assistant:

void MessageFieldGenerator::
GenerateDestructorCode(io::Printer* printer) const {
  // In google3 a default instance will never get deleted so we don't need to
  // worry about that but in opensource protobuf default instances are deleted
  // in shutdown process and we need to take special care when handling them.
  printer->Print(variables_,
    "if (this != internal_default_instance()) {\n"
    "  delete $name$_;\n"
    "}\n");
}